

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

bool __thiscall Lowerer::TryGenerateFastBrEq(Lowerer *this,Instr *instr)

{
  bool bVar1;
  bool bVar2;
  Opnd *pOVar3;
  BranchInstr *pBVar4;
  RegOpnd *local_58;
  RegOpnd *local_50;
  BranchInstr *newBranch;
  bool isConst;
  RegOpnd *srcReg2;
  RegOpnd *srcReg1;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(instr);
  bVar1 = IR::Opnd::IsRegOpnd(pOVar3);
  if (bVar1) {
    pOVar3 = IR::Instr::GetSrc1(instr);
    local_50 = IR::Opnd::AsRegOpnd(pOVar3);
  }
  else {
    local_50 = (RegOpnd *)0x0;
  }
  pOVar3 = IR::Instr::GetSrc2(instr);
  bVar1 = IR::Opnd::IsRegOpnd(pOVar3);
  if (bVar1) {
    pOVar3 = IR::Instr::GetSrc2(instr);
    local_58 = IR::Opnd::AsRegOpnd(pOVar3);
  }
  else {
    local_58 = (RegOpnd *)0x0;
  }
  bVar1 = false;
  if ((local_50 != (RegOpnd *)0x0) && (bVar2 = IsNullOrUndefRegOpnd(this,local_50), bVar2)) {
    IR::Instr::SwapOpnds(instr);
    bVar1 = true;
  }
  if ((bVar1) ||
     ((local_58 != (RegOpnd *)0x0 && (bVar1 = IsNullOrUndefRegOpnd(this,local_58), bVar1)))) {
    pBVar4 = IR::Instr::AsBranchInstr(instr);
    pOVar3 = LoadLibraryValueOpnd(this,instr,ValueNull);
    GenerateFastBrConst(this,pBVar4,pOVar3,true);
    pBVar4 = IR::Instr::AsBranchInstr(instr);
    pOVar3 = LoadLibraryValueOpnd(this,instr,ValueUndefined);
    GenerateFastBrConst(this,pBVar4,pOVar3,true);
    IR::Instr::Remove(instr);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
Lowerer::TryGenerateFastBrEq(IR::Instr * instr)
{
    IR::RegOpnd *srcReg1 = instr->GetSrc1()->IsRegOpnd() ? instr->GetSrc1()->AsRegOpnd() : nullptr;
    IR::RegOpnd *srcReg2 = instr->GetSrc2()->IsRegOpnd() ? instr->GetSrc2()->AsRegOpnd() : nullptr;

    bool isConst = false;
    if (srcReg1 && this->IsNullOrUndefRegOpnd(srcReg1))
    {
        instr->SwapOpnds();
        isConst = true;
    }

    // Fast path for == null or == undefined
    // if (src == null || src == undefined)
    if (isConst || (srcReg2 && this->IsNullOrUndefRegOpnd(srcReg2)))
    {
        IR::BranchInstr *newBranch;
        newBranch = this->GenerateFastBrConst(instr->AsBranchInstr(),
            this->LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
            true);

        this->GenerateFastBrConst(instr->AsBranchInstr(),
            this->LoadLibraryValueOpnd(instr, LibraryValue::ValueUndefined),
            true);

        instr->Remove();
        return true;
    }

    return false;
}